

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
* __thiscall
adios2::format::BP3Deserializer::PerformGetsVariablesSubFileInfo_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
           *__return_storage_ptr__,BP3Deserializer *this,IO *io)

{
  DataType DVar1;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<std::complex<float>_> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<double> *variable_04;
  Variable<int> *variable_05;
  Variable<long> *variable_06;
  Variable<unsigned_long> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_short> *variable_09;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_10;
  Variable<unsigned_int> *variable_11;
  Variable<long_double> *variable_12;
  Variable<float> *variable_13;
  _Rb_tree_node_base *p_Var2;
  string variableName;
  string local_80;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
  local_60;
  
  if ((this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var2 = (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::string((string *)&local_80,(string *)(p_Var2 + 1));
      DVar1 = core::IO::InquireVariableType(io,&local_80);
      switch(DVar1) {
      case Int8:
        variable = core::IO::InquireVariable<signed_char>(io,&local_80);
        GetSubFileInfo<signed_char>((SubFileInfoMap *)&local_60,this,variable);
        break;
      case Int16:
        variable_08 = core::IO::InquireVariable<short>(io,&local_80);
        GetSubFileInfo<short>((SubFileInfoMap *)&local_60,this,variable_08);
        break;
      case Int32:
        variable_05 = core::IO::InquireVariable<int>(io,&local_80);
        GetSubFileInfo<int>((SubFileInfoMap *)&local_60,this,variable_05);
        break;
      case Int64:
        variable_06 = core::IO::InquireVariable<long>(io,&local_80);
        GetSubFileInfo<long>((SubFileInfoMap *)&local_60,this,variable_06);
        break;
      case UInt8:
        variable_02 = core::IO::InquireVariable<unsigned_char>(io,&local_80);
        GetSubFileInfo<unsigned_char>((SubFileInfoMap *)&local_60,this,variable_02);
        break;
      case UInt16:
        variable_09 = core::IO::InquireVariable<unsigned_short>(io,&local_80);
        GetSubFileInfo<unsigned_short>((SubFileInfoMap *)&local_60,this,variable_09);
        break;
      case UInt32:
        variable_11 = core::IO::InquireVariable<unsigned_int>(io,&local_80);
        GetSubFileInfo<unsigned_int>((SubFileInfoMap *)&local_60,this,variable_11);
        break;
      case UInt64:
        variable_07 = core::IO::InquireVariable<unsigned_long>(io,&local_80);
        GetSubFileInfo<unsigned_long>((SubFileInfoMap *)&local_60,this,variable_07);
        break;
      case Float:
        variable_13 = core::IO::InquireVariable<float>(io,&local_80);
        GetSubFileInfo<float>((SubFileInfoMap *)&local_60,this,variable_13);
        break;
      case Double:
        variable_04 = core::IO::InquireVariable<double>(io,&local_80);
        GetSubFileInfo<double>((SubFileInfoMap *)&local_60,this,variable_04);
        break;
      case LongDouble:
        variable_12 = core::IO::InquireVariable<long_double>(io,&local_80);
        GetSubFileInfo<long_double>((SubFileInfoMap *)&local_60,this,variable_12);
        break;
      case FloatComplex:
        variable_01 = core::IO::InquireVariable<std::complex<float>>(io,&local_80);
        GetSubFileInfo<std::complex<float>>((SubFileInfoMap *)&local_60,this,variable_01);
        break;
      case DoubleComplex:
        variable_03 = core::IO::InquireVariable<std::complex<double>>(io,&local_80);
        GetSubFileInfo<std::complex<double>>((SubFileInfoMap *)&local_60,this,variable_03);
        break;
      case String:
        variable_10 = core::IO::InquireVariable<std::__cxx11::string>(io,&local_80);
        GetSubFileInfo<std::__cxx11::string>((SubFileInfoMap *)&local_60,this,variable_10);
        break;
      case Char:
        variable_00 = core::IO::InquireVariable<char>(io,&local_80);
        GetSubFileInfo<char>((SubFileInfoMap *)&local_60,this,variable_00);
        break;
      default:
        goto switchD_00528b2b_default;
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
      ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
                   *)(p_Var2 + 2),&local_60);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_60);
switchD_00528b2b_default:
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  std::_Rb_tree<$ba56ee05$>::_Rb_tree
            (&__return_storage_ptr__->_M_t,&(this->m_DeferredVariablesMap)._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, helper::SubFileInfoMap>
BP3Deserializer::PerformGetsVariablesSubFileInfo(core::IO &io)
{
    if (m_DeferredVariablesMap.empty())
    {
        return m_DeferredVariablesMap;
    }

    for (auto &subFileInfoPair : m_DeferredVariablesMap)
    {
        const std::string variableName(subFileInfoPair.first);
        const DataType type(io.InquireVariableType(variableName));

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        subFileInfoPair.second = GetSubFileInfo(*io.InquireVariable<T>(variableName));             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
    return m_DeferredVariablesMap;
}